

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::AddLanguageFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,cmBuildStep compileOrLink,
          string *lang,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  cmMakefile *pcVar6;
  cmValue cVar7;
  string *psVar8;
  cmValue cVar9;
  long *plVar10;
  size_type *psVar11;
  long *plVar12;
  byte bVar13;
  string *i;
  _Alloc_hider _Var14;
  undefined8 uVar15;
  long lVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  bool bVar18;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  msvcDebugInformationFormat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  cmGeneratorTarget *local_240;
  string msvcRuntimeLibrary;
  _Alloc_hider local_218 [2];
  long local_208;
  char *local_200;
  _Alloc_hider *local_1f8;
  size_type local_1f0;
  _Alloc_hider local_1e8;
  undefined8 local_1e0;
  long *local_1d8;
  char *local_1d0;
  long local_1c8 [2];
  string *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string compiler;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string compilerSimulateId;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  msvcRuntimeLibrary._M_dataplus._M_p = (pointer)0x6;
  msvcRuntimeLibrary._M_string_length = (long)"The CMAKE_" + 4;
  msvcRuntimeLibrary.field_2._M_allocated_capacity = 0;
  local_218[0]._M_p = (lang->_M_dataplus)._M_p;
  msvcRuntimeLibrary.field_2._8_8_ = lang->_M_string_length;
  local_218[1]._M_p = (pointer)0x0;
  local_208 = 6;
  local_200 = "_FLAGS";
  local_1f8 = (_Alloc_hider *)0x0;
  views._M_len = 3;
  views._M_array = (iterator)&msvcRuntimeLibrary;
  local_240 = target;
  cmCatViews((string *)&msvcDebugInformationFormat,views);
  local_1b8 = config;
  AddConfigVariableFlags(this,flags,(string *)&msvcDebugInformationFormat,config);
  if (msvcDebugInformationFormat.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p !=
      (pointer)((long)&msvcDebugInformationFormat.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 0x10)) {
    operator_delete((void *)msvcDebugInformationFormat.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
                    msvcDebugInformationFormat.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ + 1);
  }
  if (compileOrLink == Compile) {
    bVar4 = true;
    bVar18 = false;
  }
  else if (compileOrLink == Link) {
    pcVar6 = this->Makefile;
    msvcRuntimeLibrary._M_dataplus._M_p = (pointer)0x6;
    msvcRuntimeLibrary._M_string_length = (long)"The CMAKE_" + 4;
    msvcRuntimeLibrary.field_2._M_allocated_capacity = 0;
    local_218[0]._M_p = (lang->_M_dataplus)._M_p;
    msvcRuntimeLibrary.field_2._8_8_ = lang->_M_string_length;
    local_218[1]._M_p = (pointer)0x0;
    local_208 = 0x22;
    local_200 = "_LINK_WITH_STANDARD_COMPILE_OPTION";
    local_1f8 = (_Alloc_hider *)0x0;
    views_00._M_len = 3;
    views_00._M_array = (iterator)&msvcRuntimeLibrary;
    cmCatViews(&local_50,views_00);
    bVar4 = cmMakefile::IsOn(pcVar6,&local_50);
    bVar18 = true;
  }
  else {
    bVar18 = false;
    bVar4 = false;
  }
  if ((bVar18) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar4 != false) {
    compilerSimulateId._M_dataplus._M_p = (pointer)this->Makefile;
    cmStandardLevelResolver::GetCompileOptionDef
              (&msvcRuntimeLibrary,(cmStandardLevelResolver *)&compilerSimulateId,local_240,lang,
               local_1b8);
    if (msvcRuntimeLibrary._M_string_length != 0) {
      pcVar6 = cmTarget::GetMakefile(local_240->Target);
      cVar7 = cmMakefile::GetDefinition(pcVar6,&msvcRuntimeLibrary);
      if (cVar7.Value != (string *)0x0) {
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p =
             (_Alloc_hider)
             ((long)&msvcDebugInformationFormat.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10);
        pcVar2 = ((cVar7.Value)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&msvcDebugInformationFormat,pcVar2,
                   pcVar2 + (cVar7.Value)->_M_string_length);
        init._M_len = 1;
        init._M_array = (iterator)&msvcDebugInformationFormat;
        cmList::cmList((cmList *)&compiler,init);
        _Var14 = compiler._M_dataplus;
        pcVar2 = (pointer)compiler._M_string_length;
        if (msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p !=
            (pointer)((long)&msvcDebugInformationFormat.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload + 0x10)) {
          operator_delete((void *)msvcDebugInformationFormat.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._M_value._M_dataplus._M_p,
                          msvcDebugInformationFormat.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._16_8_ + 1);
          _Var14 = compiler._M_dataplus;
          pcVar2 = (pointer)compiler._M_string_length;
        }
        for (; _Var14._M_p != pcVar2; _Var14._M_p = _Var14._M_p + 0x20) {
          (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[9])(this,flags,_Var14._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&compiler);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msvcRuntimeLibrary._M_dataplus._M_p != &msvcRuntimeLibrary.field_2) {
      operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                      msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar6 = this->Makefile;
  msvcRuntimeLibrary._M_dataplus._M_p = (pointer)0x6;
  msvcRuntimeLibrary._M_string_length = (long)"The CMAKE_" + 4;
  msvcRuntimeLibrary.field_2._M_allocated_capacity = 0;
  local_218[0]._M_p = (lang->_M_dataplus)._M_p;
  msvcRuntimeLibrary.field_2._8_8_ = lang->_M_string_length;
  local_218[1]._M_p = (pointer)0x0;
  local_208 = 0xc;
  local_200 = "_COMPILER_ID";
  local_1f8 = (_Alloc_hider *)0x0;
  views_01._M_len = 3;
  views_01._M_array = (iterator)&msvcRuntimeLibrary;
  cmCatViews((string *)&msvcDebugInformationFormat,views_01);
  psVar8 = cmMakefile::GetSafeDefinition(pcVar6,(string *)&msvcDebugInformationFormat);
  compiler._M_dataplus._M_p = (pointer)&compiler.field_2;
  pcVar2 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&compiler,pcVar2,pcVar2 + psVar8->_M_string_length);
  if (msvcDebugInformationFormat.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p !=
      (pointer)((long)&msvcDebugInformationFormat.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 0x10)) {
    operator_delete((void *)msvcDebugInformationFormat.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
                    msvcDebugInformationFormat.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ + 1);
  }
  pcVar6 = this->Makefile;
  msvcRuntimeLibrary._M_dataplus._M_p = (pointer)0x6;
  msvcRuntimeLibrary._M_string_length = (long)"The CMAKE_" + 4;
  msvcRuntimeLibrary.field_2._M_allocated_capacity = 0;
  local_218[0]._M_p = (lang->_M_dataplus)._M_p;
  msvcRuntimeLibrary.field_2._8_8_ = lang->_M_string_length;
  local_218[1]._M_p = (pointer)0x0;
  local_208 = 0xc;
  local_200 = "_SIMULATE_ID";
  local_1f8 = (_Alloc_hider *)0x0;
  views_02._M_len = 3;
  views_02._M_array = (iterator)&msvcRuntimeLibrary;
  cmCatViews((string *)&msvcDebugInformationFormat,views_02);
  psVar8 = cmMakefile::GetSafeDefinition(pcVar6,(string *)&msvcDebugInformationFormat);
  compilerSimulateId._M_dataplus._M_p = (pointer)&compilerSimulateId.field_2;
  pcVar2 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&compilerSimulateId,pcVar2,pcVar2 + psVar8->_M_string_length);
  if (msvcDebugInformationFormat.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p !=
      (pointer)((long)&msvcDebugInformationFormat.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 0x10)) {
    operator_delete((void *)msvcDebugInformationFormat.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
                    msvcDebugInformationFormat.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ + 1);
  }
  iVar5 = std::__cxx11::string::compare((char *)lang);
  if (iVar5 == 0) {
    paVar17 = &msvcRuntimeLibrary.field_2;
    msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&msvcRuntimeLibrary,"Swift_LANGUAGE_VERSION","");
    cVar7 = cmGeneratorTarget::GetProperty(local_240,&msvcRuntimeLibrary);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msvcRuntimeLibrary._M_dataplus._M_p != paVar17) {
      operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                      msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
    }
    if (cVar7.Value != (string *)0x0) {
      pcVar6 = this->Makefile;
      msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar17;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&msvcRuntimeLibrary,"CMAKE_Swift_COMPILER_VERSION","");
      psVar8 = (string *)cmMakefile::GetDefinition(pcVar6,&msvcRuntimeLibrary);
      if (psVar8 == (string *)0x0) {
        psVar8 = &cmValue::Empty_abi_cxx11_;
      }
      bVar18 = cmSystemTools::VersionCompare(OP_GREATER_EQUAL,psVar8,"4.2");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msvcRuntimeLibrary._M_dataplus._M_p != paVar17) {
        operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                        msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
      }
      if (bVar18) {
        std::operator+(&msvcRuntimeLibrary,"-swift-version ",cVar7.Value);
        (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])
                  (this,flags,&msvcRuntimeLibrary);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msvcRuntimeLibrary._M_dataplus._M_p != paVar17) {
LAB_002e2101:
          operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                          msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)lang);
    if (iVar5 == 0) {
      cmGeneratorTarget::AddCUDAArchitectureFlags(local_240,compileOrLink,local_1b8,flags);
      cmGeneratorTarget::AddCUDAToolkitFlags(local_240,flags);
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)lang);
      if (iVar5 == 0) {
        cmGeneratorTarget::AddISPCTargetFlags(local_240,flags);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)lang);
        if (iVar5 == 0) {
          pcVar6 = this->Makefile;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"CMAKE_RC_COMPILER","");
          psVar8 = cmMakefile::GetSafeDefinition(pcVar6,&local_b0);
          lVar16 = std::__cxx11::string::find((char *)psVar8,0x8af702,0);
          bVar18 = lVar16 != -1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar18 = false;
        }
        if (bVar18) {
          pcVar6 = this->Makefile;
          paVar17 = &msvcRuntimeLibrary.field_2;
          msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar17;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&msvcRuntimeLibrary,"CMAKE_C_COMPILER_ID","");
          cmMakefile::GetSafeDefinition(pcVar6,&msvcRuntimeLibrary);
          std::__cxx11::string::_M_assign((string *)&compiler);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msvcRuntimeLibrary._M_dataplus._M_p != paVar17) {
            operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                            msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
          }
          pcVar6 = this->Makefile;
          if (compiler._M_string_length == 0) {
            msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar17;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&msvcRuntimeLibrary,"CMAKE_CXX_COMPILER_ID","");
            cmMakefile::GetSafeDefinition(pcVar6,&msvcRuntimeLibrary);
            std::__cxx11::string::_M_assign((string *)&compiler);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msvcRuntimeLibrary._M_dataplus._M_p != paVar17) {
              operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                              msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
            }
            pcVar6 = this->Makefile;
            msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar17;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&msvcRuntimeLibrary,"CMAKE_CXX_SIMULATE_ID","");
            cmMakefile::GetSafeDefinition(pcVar6,&msvcRuntimeLibrary);
            std::__cxx11::string::_M_assign((string *)&compilerSimulateId);
          }
          else {
            msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar17;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&msvcRuntimeLibrary,"CMAKE_C_SIMULATE_ID","");
            cmMakefile::GetSafeDefinition(pcVar6,&msvcRuntimeLibrary);
            std::__cxx11::string::_M_assign((string *)&compilerSimulateId);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msvcRuntimeLibrary._M_dataplus._M_p != paVar17) goto LAB_002e2101;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)lang);
          if (iVar5 == 0) {
            cmGeneratorTarget::AddHIPArchitectureFlags(local_240,compileOrLink,local_1b8,flags);
          }
        }
      }
    }
  }
  iVar5 = std::__cxx11::string::compare((char *)&compiler);
  if (iVar5 == 0) {
    pcVar6 = this->Makefile;
    paVar17 = &msvcRuntimeLibrary.field_2;
    msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&msvcRuntimeLibrary,"CMAKE_CLANG_VFS_OVERLAY","");
    cVar7 = cmMakefile::GetDefinition(pcVar6,&msvcRuntimeLibrary);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msvcRuntimeLibrary._M_dataplus._M_p != paVar17) {
      operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                      msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
    }
    if (cVar7.Value != (string *)0x0) {
      iVar5 = std::__cxx11::string::compare((char *)&compilerSimulateId);
      if (iVar5 == 0) {
        msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>((string *)&msvcRuntimeLibrary,"-Xclang","");
        local_218[0]._M_p = (pointer)&local_208;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"-ivfsoverlay","");
        local_1f8 = &local_1e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"-Xclang","");
        plVar10 = local_1c8;
        pcVar2 = ((cVar7.Value)->_M_dataplus)._M_p;
        local_1d8 = plVar10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d8,pcVar2,pcVar2 + (cVar7.Value)->_M_string_length);
        __l_00._M_len = 4;
        __l_00._M_array = &msvcRuntimeLibrary;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&msvcDebugInformationFormat,__l_00,(allocator_type *)&local_260);
        uVar3 = msvcDebugInformationFormat.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_string_length;
        for (uVar15 = msvcDebugInformationFormat.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_dataplus._M_p; uVar15 != uVar3; uVar15 = uVar15 + 0x20
            ) {
          (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[9])(this,flags,uVar15);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&msvcDebugInformationFormat);
        lVar16 = -0x80;
        do {
          if (plVar10 != (long *)plVar10[-2]) {
            operator_delete((long *)plVar10[-2],*plVar10 + 1);
          }
          plVar10 = plVar10 + -4;
          lVar16 = lVar16 + 0x20;
        } while (lVar16 != 0);
      }
      else {
        msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&msvcRuntimeLibrary,"-ivfsoverlay","");
        plVar10 = &local_208;
        pcVar2 = ((cVar7.Value)->_M_dataplus)._M_p;
        local_218[0]._M_p = (pointer)plVar10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_218,pcVar2,pcVar2 + (cVar7.Value)->_M_string_length);
        __l._M_len = 2;
        __l._M_array = &msvcRuntimeLibrary;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&msvcDebugInformationFormat,__l,(allocator_type *)&local_260);
        uVar3 = msvcDebugInformationFormat.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_string_length;
        for (uVar15 = msvcDebugInformationFormat.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_dataplus._M_p; uVar15 != uVar3; uVar15 = uVar15 + 0x20
            ) {
          (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[9])(this,flags,uVar15);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&msvcDebugInformationFormat);
        lVar16 = -0x40;
        do {
          if (plVar10 != (long *)plVar10[-2]) {
            operator_delete((long *)plVar10[-2],*plVar10 + 1);
          }
          plVar10 = plVar10 + -4;
          lVar16 = lVar16 + 0x20;
        } while (lVar16 != 0);
      }
    }
  }
  pcVar6 = this->Makefile;
  paVar17 = &msvcRuntimeLibrary.field_2;
  msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar17;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&msvcRuntimeLibrary,"CMAKE_MSVC_RUNTIME_LIBRARY_DEFAULT","");
  cVar7 = cmMakefile::GetDefinition(pcVar6,&msvcRuntimeLibrary);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msvcRuntimeLibrary._M_dataplus._M_p != paVar17) {
    operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                    msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
  }
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&msvcRuntimeLibrary,"MSVC_RUNTIME_LIBRARY","");
    cVar9 = cmGeneratorTarget::GetProperty(local_240,&msvcRuntimeLibrary);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msvcRuntimeLibrary._M_dataplus._M_p != paVar17) {
      operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                      msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
    }
    if (cVar9.Value != (string *)0x0) {
      cVar7 = cVar9;
    }
    pcVar2 = ((cVar7.Value)->_M_dataplus)._M_p;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar2,pcVar2 + (cVar7.Value)->_M_string_length);
    _Var14._M_p = (pointer)((long)&msvcDebugInformationFormat.
                                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ._M_payload + 0x10);
    msvcDebugInformationFormat.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length = 0;
    msvcDebugInformationFormat.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ =
         msvcDebugInformationFormat.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._16_8_ & 0xffffffffffffff00;
    msvcDebugInformationFormat.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)_Var14._M_p;
    cmGeneratorExpression::Evaluate
              (&msvcRuntimeLibrary,&local_d0,this,local_1b8,local_240,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
               (string *)&msvcDebugInformationFormat);
    if (msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p != (_Alloc_hider)_Var14._M_p) {
      operator_delete((void *)msvcDebugInformationFormat.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._M_value._M_dataplus._M_p,
                      msvcDebugInformationFormat.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (msvcRuntimeLibrary._M_string_length != 0) {
      pcVar6 = this->Makefile;
      std::operator+(&local_150,"CMAKE_",lang);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_150);
      psVar11 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_260.field_2._M_allocated_capacity = *psVar11;
        local_260.field_2._8_8_ = plVar10[3];
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      }
      else {
        local_260.field_2._M_allocated_capacity = *psVar11;
        local_260._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_260._M_string_length = plVar10[1];
      *plVar10 = (long)psVar11;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_260,(ulong)msvcRuntimeLibrary._M_dataplus._M_p);
      msvcDebugInformationFormat.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p =
           (_Alloc_hider)
           ((long)&msvcDebugInformationFormat.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload + 0x10);
      plVar12 = plVar10 + 2;
      if ((long *)*plVar10 == plVar12) {
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ = *plVar12;
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._24_8_ = plVar10[3];
      }
      else {
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ = *plVar12;
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)*plVar10;
      }
      msvcDebugInformationFormat.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length = plVar10[1];
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      cVar7 = cmMakefile::GetDefinition(pcVar6,(string *)&msvcDebugInformationFormat);
      if (msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p !=
          (pointer)((long)&msvcDebugInformationFormat.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload + 0x10)) {
        operator_delete((void *)msvcDebugInformationFormat.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._M_value._M_dataplus._M_p,
                        msvcDebugInformationFormat.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      paVar17 = &local_150.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar17) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if (cVar7.Value == (string *)0x0) {
        pcVar6 = this->Makefile;
        std::operator+(&local_260,"CMAKE_",lang);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_260);
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p =
             (_Alloc_hider)
             ((long)&msvcDebugInformationFormat.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10);
        plVar12 = plVar10 + 2;
        if ((long *)*plVar10 == plVar12) {
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ = *plVar12;
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._24_8_ = plVar10[3];
        }
        else {
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ = *plVar12;
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)*plVar10;
        }
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_string_length = plVar10[1];
        *plVar10 = (long)plVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        psVar8 = cmMakefile::GetSafeDefinition(pcVar6,(string *)&msvcDebugInformationFormat);
        iVar5 = std::__cxx11::string::compare((char *)psVar8);
        bVar18 = iVar5 != 0;
        if (iVar5 == 0) {
LAB_002e2757:
          bVar4 = true;
          if ((cmSystemTools::s_ErrorOccurred == false) &&
             (cmSystemTools::s_FatalErrorOccurred == false)) {
            bVar4 = cmSystemTools::GetInterruptFlag();
          }
          bVar13 = bVar4 ^ 1;
        }
        else {
          pcVar6 = this->Makefile;
          std::operator+(&local_70,"CMAKE_",lang);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_70);
          psVar11 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_150.field_2._M_allocated_capacity = *psVar11;
            local_150.field_2._8_8_ = plVar10[3];
            local_150._M_dataplus._M_p = (pointer)paVar17;
          }
          else {
            local_150.field_2._M_allocated_capacity = *psVar11;
            local_150._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_150._M_string_length = plVar10[1];
          *plVar10 = (long)psVar11;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          psVar8 = cmMakefile::GetSafeDefinition(pcVar6,&local_150);
          iVar5 = std::__cxx11::string::compare((char *)psVar8);
          if (iVar5 == 0) goto LAB_002e2757;
          bVar18 = true;
          bVar13 = 0;
        }
        paVar1 = &local_260.field_2;
        if (bVar18) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != paVar17) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        if (msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p !=
            (pointer)((long)&msvcDebugInformationFormat.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload + 0x10)) {
          operator_delete((void *)msvcDebugInformationFormat.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._M_value._M_dataplus._M_p,
                          msvcDebugInformationFormat.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != paVar1) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        if (bVar13 != 0) {
          std::operator+(&local_130,"MSVC_RUNTIME_LIBRARY value \'",&msvcRuntimeLibrary);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_130);
          psVar11 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_1b0.field_2._M_allocated_capacity = *psVar11;
            local_1b0.field_2._8_8_ = plVar10[3];
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          }
          else {
            local_1b0.field_2._M_allocated_capacity = *psVar11;
            local_1b0._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_1b0._M_string_length = plVar10[1];
          *plVar10 = (long)psVar11;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_1b0,(ulong)(lang->_M_dataplus)._M_p);
          psVar11 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_260.field_2._M_allocated_capacity = *psVar11;
            local_260.field_2._8_8_ = plVar10[3];
            local_260._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_260.field_2._M_allocated_capacity = *psVar11;
            local_260._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_260._M_string_length = plVar10[1];
          *plVar10 = (long)psVar11;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_260);
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p =
               (_Alloc_hider)
               ((long)&msvcDebugInformationFormat.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 0x10);
          plVar12 = plVar10 + 2;
          if ((long *)*plVar10 == plVar12) {
            msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._16_8_ = *plVar12;
            msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._24_8_ = plVar10[3];
          }
          else {
            msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._16_8_ = *plVar12;
            msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)*plVar10;
          }
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_string_length = plVar10[1];
          *plVar10 = (long)plVar12;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,
                              (string *)&msvcDebugInformationFormat,&this->DirectoryBacktrace);
          if (msvcDebugInformationFormat.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_dataplus._M_p !=
              (pointer)((long)&msvcDebugInformationFormat.
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload + 0x10)) {
            operator_delete((void *)msvcDebugInformationFormat.
                                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._M_payload._M_value._M_dataplus._M_p,
                            msvcDebugInformationFormat.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != paVar1) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        AppendCompileOptions(this,flags,cVar7.Value,(char *)0x0);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msvcRuntimeLibrary._M_dataplus._M_p != &msvcRuntimeLibrary.field_2) {
      operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                      msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
    }
  }
  paVar17 = &msvcRuntimeLibrary.field_2;
  pcVar6 = this->Makefile;
  msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar17;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&msvcRuntimeLibrary,"CMAKE_WATCOM_RUNTIME_LIBRARY_DEFAULT","");
  cVar7 = cmMakefile::GetDefinition(pcVar6,&msvcRuntimeLibrary);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msvcRuntimeLibrary._M_dataplus._M_p != paVar17) {
    operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                    msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
  }
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    msvcRuntimeLibrary._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&msvcRuntimeLibrary,"WATCOM_RUNTIME_LIBRARY","");
    cVar9 = cmGeneratorTarget::GetProperty(local_240,&msvcRuntimeLibrary);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msvcRuntimeLibrary._M_dataplus._M_p != paVar17) {
      operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                      msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
    }
    if (cVar9.Value != (string *)0x0) {
      cVar7 = cVar9;
    }
    pcVar2 = ((cVar7.Value)->_M_dataplus)._M_p;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar2,pcVar2 + (cVar7.Value)->_M_string_length);
    _Var14._M_p = (pointer)((long)&msvcDebugInformationFormat.
                                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ._M_payload + 0x10);
    msvcDebugInformationFormat.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length = 0;
    msvcDebugInformationFormat.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ =
         msvcDebugInformationFormat.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._16_8_ & 0xffffffffffffff00;
    msvcDebugInformationFormat.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)_Var14._M_p;
    cmGeneratorExpression::Evaluate
              (&msvcRuntimeLibrary,&local_f0,this,local_1b8,local_240,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
               (string *)&msvcDebugInformationFormat);
    if (msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p != (_Alloc_hider)_Var14._M_p) {
      operator_delete((void *)msvcDebugInformationFormat.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._M_value._M_dataplus._M_p,
                      msvcDebugInformationFormat.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (msvcRuntimeLibrary._M_string_length != 0) {
      pcVar6 = this->Makefile;
      std::operator+(&local_1b0,"CMAKE_",lang);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_1b0);
      psVar11 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_260.field_2._M_allocated_capacity = *psVar11;
        local_260.field_2._8_8_ = plVar10[3];
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      }
      else {
        local_260.field_2._M_allocated_capacity = *psVar11;
        local_260._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_260._M_string_length = plVar10[1];
      *plVar10 = (long)psVar11;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_260,(ulong)msvcRuntimeLibrary._M_dataplus._M_p);
      msvcDebugInformationFormat.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p =
           (_Alloc_hider)
           ((long)&msvcDebugInformationFormat.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload + 0x10);
      plVar12 = plVar10 + 2;
      if ((long *)*plVar10 == plVar12) {
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ = *plVar12;
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._24_8_ = plVar10[3];
      }
      else {
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ = *plVar12;
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)*plVar10;
      }
      msvcDebugInformationFormat.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length = plVar10[1];
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      cVar7 = cmMakefile::GetDefinition(pcVar6,(string *)&msvcDebugInformationFormat);
      if (msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p !=
          (pointer)((long)&msvcDebugInformationFormat.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload + 0x10)) {
        operator_delete((void *)msvcDebugInformationFormat.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._M_value._M_dataplus._M_p,
                        msvcDebugInformationFormat.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      paVar17 = &local_1b0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != paVar17) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      if (cVar7.Value == (string *)0x0) {
        pcVar6 = this->Makefile;
        std::operator+(&local_260,"CMAKE_",lang);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_260);
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p =
             (_Alloc_hider)
             ((long)&msvcDebugInformationFormat.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10);
        plVar12 = plVar10 + 2;
        if ((long *)*plVar10 == plVar12) {
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ = *plVar12;
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._24_8_ = plVar10[3];
        }
        else {
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ = *plVar12;
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)*plVar10;
        }
        msvcDebugInformationFormat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_string_length = plVar10[1];
        *plVar10 = (long)plVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        psVar8 = cmMakefile::GetSafeDefinition(pcVar6,(string *)&msvcDebugInformationFormat);
        iVar5 = std::__cxx11::string::compare((char *)psVar8);
        bVar18 = iVar5 != 0;
        if (iVar5 == 0) {
LAB_002e2dc1:
          bVar4 = true;
          if ((cmSystemTools::s_ErrorOccurred == false) &&
             (cmSystemTools::s_FatalErrorOccurred == false)) {
            bVar4 = cmSystemTools::GetInterruptFlag();
          }
          bVar13 = bVar4 ^ 1;
        }
        else {
          pcVar6 = this->Makefile;
          std::operator+(&local_130,"CMAKE_",lang);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_130);
          psVar11 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_1b0.field_2._M_allocated_capacity = *psVar11;
            local_1b0.field_2._8_8_ = plVar10[3];
            local_1b0._M_dataplus._M_p = (pointer)paVar17;
          }
          else {
            local_1b0.field_2._M_allocated_capacity = *psVar11;
            local_1b0._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_1b0._M_string_length = plVar10[1];
          *plVar10 = (long)psVar11;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          psVar8 = cmMakefile::GetSafeDefinition(pcVar6,&local_1b0);
          iVar5 = std::__cxx11::string::compare((char *)psVar8);
          if (iVar5 == 0) goto LAB_002e2dc1;
          bVar18 = true;
          bVar13 = 0;
        }
        paVar1 = &local_260.field_2;
        if (bVar18) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != paVar17) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
        }
        if (msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p !=
            (pointer)((long)&msvcDebugInformationFormat.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload + 0x10)) {
          operator_delete((void *)msvcDebugInformationFormat.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._M_value._M_dataplus._M_p,
                          msvcDebugInformationFormat.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != paVar1) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        if (bVar13 != 0) {
          std::operator+(&local_90,"WATCOM_RUNTIME_LIBRARY value \'",&msvcRuntimeLibrary);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_90);
          psVar11 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_170.field_2._M_allocated_capacity = *psVar11;
            local_170.field_2._8_8_ = plVar10[3];
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          }
          else {
            local_170.field_2._M_allocated_capacity = *psVar11;
            local_170._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_170._M_string_length = plVar10[1];
          *plVar10 = (long)psVar11;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_170,(ulong)(lang->_M_dataplus)._M_p);
          psVar11 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_260.field_2._M_allocated_capacity = *psVar11;
            local_260.field_2._8_8_ = plVar10[3];
            local_260._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_260.field_2._M_allocated_capacity = *psVar11;
            local_260._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_260._M_string_length = plVar10[1];
          *plVar10 = (long)psVar11;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_260);
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p =
               (_Alloc_hider)
               ((long)&msvcDebugInformationFormat.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 0x10);
          plVar12 = plVar10 + 2;
          if ((long *)*plVar10 == plVar12) {
            msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._16_8_ = *plVar12;
            msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._24_8_ = plVar10[3];
          }
          else {
            msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._16_8_ = *plVar12;
            msvcDebugInformationFormat.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)*plVar10;
          }
          msvcDebugInformationFormat.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_string_length = plVar10[1];
          *plVar10 = (long)plVar12;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,
                              (string *)&msvcDebugInformationFormat,&this->DirectoryBacktrace);
          if (msvcDebugInformationFormat.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_dataplus._M_p !=
              (pointer)((long)&msvcDebugInformationFormat.
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload + 0x10)) {
            operator_delete((void *)msvcDebugInformationFormat.
                                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._M_payload._M_value._M_dataplus._M_p,
                            msvcDebugInformationFormat.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != paVar1) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        AppendCompileOptions(this,flags,cVar7.Value,(char *)0x0);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msvcRuntimeLibrary._M_dataplus._M_p != &msvcRuntimeLibrary.field_2) {
      operator_delete(msvcRuntimeLibrary._M_dataplus._M_p,
                      msvcRuntimeLibrary.field_2._M_allocated_capacity + 1);
    }
  }
  GetMSVCDebugFormatName(&msvcDebugInformationFormat,this,local_1b8,local_240);
  if ((msvcDebugInformationFormat.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged != true) ||
     (msvcDebugInformationFormat.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length == 0)) goto LAB_002e3390;
  pcVar6 = this->Makefile;
  msvcRuntimeLibrary._M_dataplus._M_p = (pointer)0x6;
  msvcRuntimeLibrary._M_string_length = (long)"The CMAKE_" + 4;
  msvcRuntimeLibrary.field_2._M_allocated_capacity = 0;
  local_218[0]._M_p = (lang->_M_dataplus)._M_p;
  msvcRuntimeLibrary.field_2._8_8_ = lang->_M_string_length;
  local_218[1]._M_p = (pointer)0x0;
  local_208 = 0x2f;
  local_200 = "_COMPILE_OPTIONS_MSVC_DEBUG_INFORMATION_FORMAT_";
  local_1f8 = (_Alloc_hider *)0x0;
  local_1f0 = msvcDebugInformationFormat.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_string_length;
  local_1e8._M_p =
       (pointer)msvcDebugInformationFormat.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_dataplus._M_p;
  local_1e0 = 0;
  views_03._M_len = 4;
  views_03._M_array = (iterator)&msvcRuntimeLibrary;
  cmCatViews(&local_260,views_03);
  cVar7 = cmMakefile::GetDefinition(pcVar6,&local_260);
  paVar17 = &local_260.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != paVar17) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (cVar7.Value != (string *)0x0) {
    AppendCompileOptions(this,flags,cVar7.Value,(char *)0x0);
    goto LAB_002e3390;
  }
  pcVar6 = this->Makefile;
  msvcRuntimeLibrary._M_dataplus._M_p = (pointer)0x6;
  msvcRuntimeLibrary._M_string_length = (long)"The CMAKE_" + 4;
  msvcRuntimeLibrary.field_2._M_allocated_capacity = 0;
  local_218[0]._M_p = (lang->_M_dataplus)._M_p;
  msvcRuntimeLibrary.field_2._8_8_ = lang->_M_string_length;
  local_218[1]._M_p = (pointer)0x0;
  local_208 = 0xc;
  local_200 = "_COMPILER_ID";
  local_1f8 = (_Alloc_hider *)0x0;
  views_04._M_len = 3;
  views_04._M_array = (iterator)&msvcRuntimeLibrary;
  cmCatViews(&local_260,views_04);
  psVar8 = cmMakefile::GetSafeDefinition(pcVar6,&local_260);
  if (psVar8->_M_string_length == 4) {
    iVar5 = bcmp((psVar8->_M_dataplus)._M_p,"MSVC",4);
    bVar18 = iVar5 == 0;
  }
  else {
    bVar18 = false;
  }
  if (bVar18) {
LAB_002e31c3:
    bVar18 = (bool)(bVar18 ^ 1);
    bVar4 = true;
    if ((cmSystemTools::s_ErrorOccurred == false) && (cmSystemTools::s_FatalErrorOccurred == false))
    {
      bVar4 = cmSystemTools::GetInterruptFlag();
    }
    bVar13 = bVar4 ^ 1;
  }
  else {
    pcVar6 = this->Makefile;
    msvcRuntimeLibrary._M_dataplus._M_p = (pointer)0x6;
    msvcRuntimeLibrary._M_string_length = (long)"The CMAKE_" + 4;
    msvcRuntimeLibrary.field_2._M_allocated_capacity = 0;
    local_218[0]._M_p = (lang->_M_dataplus)._M_p;
    msvcRuntimeLibrary.field_2._8_8_ = lang->_M_string_length;
    local_218[1]._M_p = (pointer)0x0;
    local_208 = 0xc;
    local_200 = "_SIMULATE_ID";
    local_1f8 = (_Alloc_hider *)0x0;
    views_05._M_len = 3;
    views_05._M_array = (iterator)&msvcRuntimeLibrary;
    cmCatViews(&local_170,views_05);
    psVar8 = cmMakefile::GetSafeDefinition(pcVar6,&local_170);
    if ((psVar8->_M_string_length == 4) &&
       (iVar5 = bcmp((psVar8->_M_dataplus)._M_p,"MSVC",4), iVar5 == 0)) goto LAB_002e31c3;
    bVar13 = 0;
    bVar18 = true;
  }
  if ((bVar18) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2)) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != paVar17) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (bVar13 != 0) {
    msvcRuntimeLibrary._M_dataplus._M_p = (pointer)0x25;
    msvcRuntimeLibrary._M_string_length = (size_type)anon_var_dwarf_b06907;
    msvcRuntimeLibrary.field_2._M_allocated_capacity = 0;
    msvcRuntimeLibrary.field_2._8_8_ =
         msvcDebugInformationFormat.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length;
    local_218[0]._M_p =
         (pointer)msvcDebugInformationFormat.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_dataplus._M_p;
    local_218[1]._M_p = (pointer)0x0;
    local_208 = 0x15;
    local_200 = "\' not known for this ";
    local_1f8 = (_Alloc_hider *)0x0;
    local_1e8._M_p = (lang->_M_dataplus)._M_p;
    local_1f0 = lang->_M_string_length;
    local_1e0 = 0;
    local_1d8 = (long *)0xa;
    local_1d0 = " compiler.";
    local_1c8[0] = 0;
    views_06._M_len = 5;
    views_06._M_array = (iterator)&msvcRuntimeLibrary;
    cmCatViews(&local_260,views_06);
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,&local_260,
                        &this->DirectoryBacktrace);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar17) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
  }
LAB_002e3390:
  if ((msvcDebugInformationFormat.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged == true) &&
     (msvcDebugInformationFormat.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false,
     msvcDebugInformationFormat.
     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
     ._M_payload.
     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
     .
     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ._M_payload._M_value._M_dataplus._M_p !=
     (pointer)((long)&msvcDebugInformationFormat.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 0x10))) {
    operator_delete((void *)msvcDebugInformationFormat.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
                    msvcDebugInformationFormat.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compilerSimulateId._M_dataplus._M_p != &compilerSimulateId.field_2) {
    operator_delete(compilerSimulateId._M_dataplus._M_p,
                    compilerSimulateId.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compiler._M_dataplus._M_p != &compiler.field_2) {
    operator_delete(compiler._M_dataplus._M_p,compiler.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddLanguageFlags(std::string& flags,
                                        cmGeneratorTarget const* target,
                                        cmBuildStep compileOrLink,
                                        const std::string& lang,
                                        const std::string& config)
{
  // Add language-specific flags.
  this->AddConfigVariableFlags(flags, cmStrCat("CMAKE_", lang, "_FLAGS"),
                               config);

  // Add the language standard flag for compiling, and sometimes linking.
  if (compileOrLink == cmBuildStep::Compile ||
      (compileOrLink == cmBuildStep::Link &&
       // Some toolchains require use of the language standard flag
       // when linking in order to use the matching standard library.
       // FIXME: If CMake gains an abstraction for standard library
       // selection, this will have to be reconciled with it.
       this->Makefile->IsOn(
         cmStrCat("CMAKE_", lang, "_LINK_WITH_STANDARD_COMPILE_OPTION")))) {
    cmStandardLevelResolver standardResolver(this->Makefile);
    std::string const& optionFlagDef =
      standardResolver.GetCompileOptionDef(target, lang, config);
    if (!optionFlagDef.empty()) {
      cmValue opt =
        target->Target->GetMakefile()->GetDefinition(optionFlagDef);
      if (opt) {
        cmList optList{ *opt };
        for (std::string const& i : optList) {
          this->AppendFlagEscape(flags, i);
        }
      }
    }
  }

  std::string compiler = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILER_ID"));

  std::string compilerSimulateId = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_SIMULATE_ID"));

  if (lang == "Swift") {
    if (cmValue v = target->GetProperty("Swift_LANGUAGE_VERSION")) {
      if (cmSystemTools::VersionCompare(
            cmSystemTools::OP_GREATER_EQUAL,
            this->Makefile->GetDefinition("CMAKE_Swift_COMPILER_VERSION"),
            "4.2")) {
        this->AppendFlags(flags, "-swift-version " + *v);
      }
    }
  } else if (lang == "CUDA") {
    target->AddCUDAArchitectureFlags(compileOrLink, config, flags);
    target->AddCUDAToolkitFlags(flags);
  } else if (lang == "ISPC") {
    target->AddISPCTargetFlags(flags);
  } else if (lang == "RC" &&
             this->Makefile->GetSafeDefinition("CMAKE_RC_COMPILER")
                 .find("llvm-rc") != std::string::npos) {
    compiler = this->Makefile->GetSafeDefinition("CMAKE_C_COMPILER_ID");
    if (!compiler.empty()) {
      compilerSimulateId =
        this->Makefile->GetSafeDefinition("CMAKE_C_SIMULATE_ID");
    } else {
      compiler = this->Makefile->GetSafeDefinition("CMAKE_CXX_COMPILER_ID");
      compilerSimulateId =
        this->Makefile->GetSafeDefinition("CMAKE_CXX_SIMULATE_ID");
    }
  } else if (lang == "HIP") {
    target->AddHIPArchitectureFlags(compileOrLink, config, flags);
  }

  // Add VFS Overlay for Clang compilers
  if (compiler == "Clang") {
    if (cmValue vfsOverlay =
          this->Makefile->GetDefinition("CMAKE_CLANG_VFS_OVERLAY")) {
      if (compilerSimulateId == "MSVC") {
        this->AppendCompileOptions(
          flags,
          std::vector<std::string>{ "-Xclang", "-ivfsoverlay", "-Xclang",
                                    *vfsOverlay });
      } else {
        this->AppendCompileOptions(
          flags, std::vector<std::string>{ "-ivfsoverlay", *vfsOverlay });
      }
    }
  }
  // Add MSVC runtime library flags.  This is activated by the presence
  // of a default selection whether or not it is overridden by a property.
  cmValue msvcRuntimeLibraryDefault =
    this->Makefile->GetDefinition("CMAKE_MSVC_RUNTIME_LIBRARY_DEFAULT");
  if (cmNonempty(msvcRuntimeLibraryDefault)) {
    cmValue msvcRuntimeLibraryValue =
      target->GetProperty("MSVC_RUNTIME_LIBRARY");
    if (!msvcRuntimeLibraryValue) {
      msvcRuntimeLibraryValue = msvcRuntimeLibraryDefault;
    }
    std::string const msvcRuntimeLibrary = cmGeneratorExpression::Evaluate(
      *msvcRuntimeLibraryValue, this, config, target);
    if (!msvcRuntimeLibrary.empty()) {
      if (cmValue msvcRuntimeLibraryOptions = this->Makefile->GetDefinition(
            "CMAKE_" + lang + "_COMPILE_OPTIONS_MSVC_RUNTIME_LIBRARY_" +
            msvcRuntimeLibrary)) {
        this->AppendCompileOptions(flags, *msvcRuntimeLibraryOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_COMPILER_ID") == "MSVC" ||
                  this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_SIMULATE_ID") == "MSVC") &&
                 !cmSystemTools::GetErrorOccurredFlag()) {
        // The compiler uses the MSVC ABI so it needs a known runtime library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           "MSVC_RUNTIME_LIBRARY value '" +
                             msvcRuntimeLibrary + "' not known for this " +
                             lang + " compiler.");
      }
    }
  }

  // Add Watcom runtime library flags.  This is activated by the presence
  // of a default selection whether or not it is overridden by a property.
  cmValue watcomRuntimeLibraryDefault =
    this->Makefile->GetDefinition("CMAKE_WATCOM_RUNTIME_LIBRARY_DEFAULT");
  if (cmNonempty(watcomRuntimeLibraryDefault)) {
    cmValue watcomRuntimeLibraryValue =
      target->GetProperty("WATCOM_RUNTIME_LIBRARY");
    if (!watcomRuntimeLibraryValue) {
      watcomRuntimeLibraryValue = watcomRuntimeLibraryDefault;
    }
    std::string const watcomRuntimeLibrary = cmGeneratorExpression::Evaluate(
      *watcomRuntimeLibraryValue, this, config, target);
    if (!watcomRuntimeLibrary.empty()) {
      if (cmValue watcomRuntimeLibraryOptions = this->Makefile->GetDefinition(
            "CMAKE_" + lang + "_COMPILE_OPTIONS_WATCOM_RUNTIME_LIBRARY_" +
            watcomRuntimeLibrary)) {
        this->AppendCompileOptions(flags, *watcomRuntimeLibraryOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_COMPILER_ID") == "OpenWatcom" ||
                  this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_SIMULATE_ID") == "OpenWatcom") &&
                 !cmSystemTools::GetErrorOccurredFlag()) {
        // The compiler uses the Watcom ABI so it needs a known runtime
        // library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           "WATCOM_RUNTIME_LIBRARY value '" +
                             watcomRuntimeLibrary + "' not known for this " +
                             lang + " compiler.");
      }
    }
  }

  // Add MSVC debug information format flags if CMP0141 is NEW.
  if (cm::optional<std::string> msvcDebugInformationFormat =
        this->GetMSVCDebugFormatName(config, target)) {
    if (!msvcDebugInformationFormat->empty()) {
      if (cmValue msvcDebugInformationFormatOptions =
            this->Makefile->GetDefinition(
              cmStrCat("CMAKE_", lang,
                       "_COMPILE_OPTIONS_MSVC_DEBUG_INFORMATION_FORMAT_",
                       *msvcDebugInformationFormat))) {
        this->AppendCompileOptions(flags, *msvcDebugInformationFormatOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_COMPILER_ID")) == "MSVC"_s ||
                  this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_SIMULATE_ID")) == "MSVC"_s) &&
                 !cmSystemTools::GetErrorOccurredFlag()) {
        // The compiler uses the MSVC ABI so it needs a known runtime library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           cmStrCat("MSVC_DEBUG_INFORMATION_FORMAT value '",
                                    *msvcDebugInformationFormat,
                                    "' not known for this ", lang,
                                    " compiler."));
      }
    }
  }
}